

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmem.c
# Opt level: O3

gpointer g_try_malloc(gsize n_bytes)

{
  void *pvVar1;
  
  if (n_bytes == 0) {
    return (gpointer)0x0;
  }
  pvVar1 = malloc(n_bytes);
  return pvVar1;
}

Assistant:

gpointer g_try_malloc (gsize n_bytes)
{
    gpointer mem;

    if (n_bytes)
        mem = malloc (n_bytes);
    else
        mem = NULL;

    return mem;
}